

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

void gimage::anon_unknown_11::writePNMHeader
               (char *name,char *type,long width,long height,long maxval,float scale)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  ofstream out;
  undefined1 auStack_238 [4];
  float local_234;
  long local_230;
  filebuf local_228 [20];
  undefined4 auStack_214 [55];
  ios_base local_138 [264];
  
  local_234 = scale;
  std::ofstream::ofstream(&local_230);
  lVar1 = *(long *)(local_230 + -0x18);
  *(undefined4 *)((long)auStack_214 + lVar1) = 5;
  std::ios::clear((int)auStack_238 + (int)lVar1 + 8);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)name);
  if (type == (char *)0x0) {
    std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_230 + -0x18) + 8);
  }
  else {
    sVar3 = strlen(type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,type,sVar3);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<long>((long)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  iVar2 = strcmp(type,"Pf");
  if (iVar2 != 0) {
    iVar2 = strcmp(type,"PF");
    if (iVar2 != 0) {
      poVar4 = std::ostream::_M_insert<long>((long)&local_230);
      goto LAB_0013c255;
    }
  }
  poVar4 = std::ostream::_M_insert<double>((double)local_234);
LAB_0013c255:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writePNMHeader(const char *name, const char *type, long width,
                    long height, long maxval, float scale)
{
  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    out.open(name, std::ios::binary);
    out << type << std::endl;
    out << width << " " << height << std::endl;

    if (strcmp(type, "Pf") == 0 || strcmp(type, "PF") == 0)
    {
      out << scale << "\n";
    }
    else
    {
      out << maxval << "\n";
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}